

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_tests.cpp
# Opt level: O2

void __thiscall transaction_tests::test_witness::test_method(test_witness *this)

{
  long lVar1;
  CTxIn *pCVar2;
  CScript *pCVar3;
  iterator in_R8;
  iterator pvVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  iterator in_R9;
  iterator pvVar6;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  span<const_std::byte,_18446744073709551615UL> b;
  span<const_std::byte,_18446744073709551615UL> b_00;
  span<const_std::byte,_18446744073709551615UL> b_01;
  span<const_std::byte,_18446744073709551615UL> b_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  CTransactionRef tx;
  CTransactionRef tx_00;
  CTransactionRef tx_01;
  CTransactionRef tx_02;
  check_type cVar7;
  undefined1 local_ce8 [56];
  char *local_cb0;
  undefined1 local_ca8 [56];
  char *local_c70;
  undefined1 local_c68 [56];
  char *local_c30;
  undefined1 local_c28 [56];
  char *local_bf0;
  CTransactionRef output2;
  CTransactionRef output1;
  char *local_bc8;
  char *local_bc0;
  undefined1 *local_bb8;
  undefined1 *local_bb0;
  char *local_ba8;
  char *local_ba0;
  char *local_b98;
  char *local_b90;
  undefined1 *local_b88;
  undefined1 *local_b80;
  char *local_b78;
  char *local_b70;
  char *local_b68;
  char *local_b60;
  undefined1 *local_b58;
  undefined1 *local_b50;
  char *local_b48;
  char *local_b40;
  char *local_b38;
  char *local_b30;
  undefined1 *local_b28;
  undefined1 *local_b20;
  char *local_b18;
  char *local_b10;
  char *local_b08;
  char *local_b00;
  undefined1 *local_af8;
  undefined1 *local_af0;
  char *local_ae8;
  char *local_ae0;
  char *local_ad8;
  char *local_ad0;
  undefined1 *local_ac8;
  undefined1 *local_ac0;
  char *local_ab8;
  char *local_ab0;
  char *local_aa8;
  char *local_aa0;
  undefined1 *local_a98;
  undefined1 *local_a90;
  char *local_a88;
  char *local_a80;
  char *local_a78;
  char *local_a70;
  undefined1 *local_a68;
  undefined1 *local_a60;
  char *local_a58;
  char *local_a50;
  char *local_a48;
  char *local_a40;
  undefined1 *local_a38;
  undefined1 *local_a30;
  char *local_a28;
  char *local_a20;
  char *local_a18;
  char *local_a10;
  undefined1 *local_a08;
  undefined1 *local_a00;
  char *local_9f8;
  char *local_9f0;
  char *local_9e8;
  char *local_9e0;
  undefined1 *local_9d8;
  undefined1 *local_9d0;
  char *local_9c8;
  char *local_9c0;
  char *local_9b8;
  char *local_9b0;
  undefined1 *local_9a8;
  undefined1 *local_9a0;
  char *local_998;
  char *local_990;
  char *local_988;
  char *local_980;
  undefined1 *local_978;
  undefined1 *local_970;
  char *local_968;
  char *local_960;
  vector<CPubKey,_std::allocator<CPubKey>_> oneandthree;
  char *local_938;
  char *local_930;
  undefined1 *local_928;
  undefined1 *local_920;
  char *local_918;
  char *local_910;
  char *local_908;
  char *local_900;
  undefined1 *local_8f8;
  undefined1 *local_8f0;
  char *local_8e8;
  char *local_8e0;
  char *local_8d8;
  char *local_8d0;
  undefined1 *local_8c8;
  undefined1 *local_8c0;
  char *local_8b8;
  char *local_8b0;
  char *local_8a8;
  char *local_8a0;
  undefined1 *local_898;
  undefined1 *local_890;
  char *local_888;
  char *local_880;
  CKey key2L;
  CKey key1L;
  CKey key3;
  CKey key2;
  CKey key1;
  undefined1 local_828 [16];
  undefined1 *local_818 [7];
  direct_or_indirect local_7e0 [30];
  _func_int **local_490;
  pointer puStack_488;
  uchar local_480 [8];
  undefined1 local_478 [32];
  CMutableTransaction input2;
  CMutableTransaction input1;
  CScript destination_script_multi;
  CScript destination_script_2L;
  CScript destination_script_1L;
  CScript destination_script_2;
  CScript destination_script_1;
  CScript scriptMulti;
  CScript scriptPubkey2L;
  CScript scriptPubkey1L;
  CScript scriptPubkey2;
  CScript scriptPubkey1;
  CPubKey pubkey2L;
  CPubKey pubkey1L;
  CPubKey pubkey3;
  CPubKey pubkey2;
  CPubKey pubkey1;
  FillableSigningProvider keystore2;
  FillableSigningProvider keystore;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header;
  keystore.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FillableSigningProvider_0114aee0;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._8_8_ = 0;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__align = 0;
  keystore2.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keystore2.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header;
  keystore2.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FillableSigningProvider_0114aee0;
  keystore2.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keystore2.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keystore2.mapKeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keystore2.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keystore2.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header;
  keystore2.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __prev = (__pthread_internal_list *)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __next = (__pthread_internal_list *)0x0;
  keystore2.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._16_8_ = 1;
  keystore2.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._8_8_ = 0;
  keystore2.mapScripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keystore2.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__align = 0;
  keystore2.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __prev = (__pthread_internal_list *)0x0;
  keystore2.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __next = (__pthread_internal_list *)0x0;
  keystore2.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._16_8_ = 1;
  keystore2.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keystore2.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keystore2.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keystore2.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  GenerateRandomKey(SUB81(&key1,0));
  GenerateRandomKey(SUB81(&key2,0));
  GenerateRandomKey(SUB81(&key3,0));
  GenerateRandomKey(SUB81(&key1L,0));
  GenerateRandomKey(SUB81(&key2L,0));
  CKey::GetPubKey(&pubkey1,&key1);
  CKey::GetPubKey(&pubkey2,&key2);
  CKey::GetPubKey(&pubkey3,&key3);
  CKey::GetPubKey(&pubkey1L,&key1L);
  CKey::GetPubKey(&pubkey2L,&key2L);
  local_888 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_880 = "";
  local_898 = &boost::unit_test::basic_cstring<char_const>::null;
  local_890 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x269;
  file.m_begin = (iterator)&local_888;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_898,msg);
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = FillableSigningProvider::AddKeyPubKey(&keystore,&key1,&pubkey1);
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_11aad58;
  input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xc3ea61;
  local_828._8_8_ = local_828._8_8_ & 0xffffffffffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_0113a070;
  local_818[0] = boost::unit_test::lazy_ostream::inst;
  local_8a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_8a0 = "";
  pvVar4 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_818[1] = (undefined1 *)&input2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&input1,(lazy_ostream *)local_828,1,0,WARN,_cVar7,
             (size_t)&local_8a8,0x269);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_8b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_8b0 = "";
  local_8c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar4;
  file_00.m_end = (iterator)0x26a;
  file_00.m_begin = (iterator)&local_8b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_8c8,
             msg_00);
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = FillableSigningProvider::AddKeyPubKey(&keystore,&key2,&pubkey2);
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_11aad72;
  input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xc3ea86;
  local_828._8_8_ = local_828._8_8_ & 0xffffffffffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_0113a070;
  local_818[0] = boost::unit_test::lazy_ostream::inst;
  local_8d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_8d0 = "";
  pvVar4 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_818[1] = (undefined1 *)&input2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&input1,(lazy_ostream *)local_828,1,0,WARN,_cVar7,
             (size_t)&local_8d8,0x26a);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_8e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_8e0 = "";
  local_8f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar6;
  msg_01.m_begin = pvVar4;
  file_01.m_end = (iterator)0x26b;
  file_01.m_begin = (iterator)&local_8e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_8f8,
             msg_01);
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = FillableSigningProvider::AddKeyPubKey(&keystore,&key1L,&pubkey1L);
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_11aad7e;
  input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xc3eaad;
  local_828._8_8_ = local_828._8_8_ & 0xffffffffffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_0113a070;
  local_818[0] = boost::unit_test::lazy_ostream::inst;
  local_908 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_900 = "";
  pvVar4 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_818[1] = (undefined1 *)&input2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&input1,(lazy_ostream *)local_828,1,0,WARN,_cVar7,
             (size_t)&local_908,0x26b);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_918 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_910 = "";
  local_928 = &boost::unit_test::basic_cstring<char_const>::null;
  local_920 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar6;
  msg_02.m_begin = pvVar4;
  file_02.m_end = (iterator)0x26c;
  file_02.m_begin = (iterator)&local_918;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_928,
             msg_02);
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = FillableSigningProvider::AddKeyPubKey(&keystore,&key2L,&pubkey2L);
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_11aad98;
  input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xc3ead4;
  local_828._8_8_ = local_828._8_8_ & 0xffffffffffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_0113a070;
  local_818[0] = boost::unit_test::lazy_ostream::inst;
  local_938 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_930 = "";
  pvVar4 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_818[1] = (undefined1 *)&input2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&input1,(lazy_ostream *)local_828,1,0,WARN,_cVar7,
             (size_t)&local_938,0x26c);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  scriptPubkey1.super_CScriptBase._union._16_8_ = 0;
  scriptPubkey1.super_CScriptBase._24_8_ = 0;
  scriptPubkey1.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  scriptPubkey1.super_CScriptBase._union._8_8_ = 0;
  scriptPubkey2.super_CScriptBase._union._16_8_ = 0;
  scriptPubkey2.super_CScriptBase._24_8_ = 0;
  scriptPubkey2.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  scriptPubkey2.super_CScriptBase._union._8_8_ = 0;
  scriptPubkey1L.super_CScriptBase._union._16_8_ = 0;
  scriptPubkey1L.super_CScriptBase._24_8_ = 0;
  scriptPubkey1L.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  scriptPubkey1L.super_CScriptBase._union._8_8_ = 0;
  scriptPubkey2L.super_CScriptBase._union._16_8_ = 0;
  scriptPubkey2L.super_CScriptBase._24_8_ = 0;
  scriptPubkey2L.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  scriptPubkey2L.super_CScriptBase._union._8_8_ = 0;
  scriptMulti.super_CScriptBase._union._16_8_ = 0;
  scriptMulti.super_CScriptBase._24_8_ = 0;
  scriptMulti.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  scriptMulti.super_CScriptBase._union._8_8_ = 0;
  ToByteVector<CPubKey>((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_828,&pubkey1)
  ;
  b._M_extent._M_extent_value = local_828._8_8_ - local_828._0_8_;
  b._M_ptr = (pointer)local_828._0_8_;
  pCVar3 = CScript::operator<<(&scriptPubkey1,b);
  CScript::operator<<(pCVar3,OP_CHECKSIG);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_828);
  ToByteVector<CPubKey>((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_828,&pubkey2)
  ;
  b_00._M_extent._M_extent_value = local_828._8_8_ - local_828._0_8_;
  b_00._M_ptr = (pointer)local_828._0_8_;
  pCVar3 = CScript::operator<<(&scriptPubkey2,b_00);
  CScript::operator<<(pCVar3,OP_CHECKSIG);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_828);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_828,&pubkey1L);
  b_01._M_extent._M_extent_value = local_828._8_8_ - local_828._0_8_;
  b_01._M_ptr = (pointer)local_828._0_8_;
  pCVar3 = CScript::operator<<(&scriptPubkey1L,b_01);
  CScript::operator<<(pCVar3,OP_CHECKSIG);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_828);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_828,&pubkey2L);
  b_02._M_extent._M_extent_value = local_828._8_8_ - local_828._0_8_;
  b_02._M_ptr = (pointer)local_828._0_8_;
  pCVar3 = CScript::operator<<(&scriptPubkey2L,b_02);
  CScript::operator<<(pCVar3,OP_CHECKSIG);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_828);
  oneandthree.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  oneandthree.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  oneandthree.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<CPubKey,_std::allocator<CPubKey>_>::push_back(&oneandthree,&pubkey1);
  std::vector<CPubKey,_std::allocator<CPubKey>_>::push_back(&oneandthree,&pubkey3);
  GetScriptForMultisig((CScript *)local_828,2,&oneandthree);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&scriptMulti.super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_828);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_828);
  local_968 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_960 = "";
  local_978 = &boost::unit_test::basic_cstring<char_const>::null;
  local_970 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar6;
  msg_03.m_begin = pvVar4;
  file_03.m_end = (iterator)0x276;
  file_03.m_begin = (iterator)&local_968;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_978,
             msg_03);
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = FillableSigningProvider::AddCScript(&keystore,&scriptPubkey1);
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_11aada4;
  input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xc3eaf7;
  local_828._8_8_ = local_828._8_8_ & 0xffffffffffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_0113a070;
  local_818[0] = boost::unit_test::lazy_ostream::inst;
  local_988 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_980 = "";
  pvVar4 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_818[1] = (undefined1 *)&input2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&input1,(lazy_ostream *)local_828,1,0,WARN,_cVar7,
             (size_t)&local_988,0x276);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_998 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_990 = "";
  local_9a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar6;
  msg_04.m_begin = pvVar4;
  file_04.m_end = (iterator)0x277;
  file_04.m_begin = (iterator)&local_998;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_9a8,
             msg_04);
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = FillableSigningProvider::AddCScript(&keystore,&scriptPubkey2);
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_11aadbe;
  input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xc3eb1a;
  local_828._8_8_ = local_828._8_8_ & 0xffffffffffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_0113a070;
  local_818[0] = boost::unit_test::lazy_ostream::inst;
  local_9b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_9b0 = "";
  pvVar4 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_818[1] = (undefined1 *)&input2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&input1,(lazy_ostream *)local_828,1,0,WARN,_cVar7,
             (size_t)&local_9b8,0x277);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_9c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_9c0 = "";
  local_9d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar6;
  msg_05.m_begin = pvVar4;
  file_05.m_end = (iterator)0x278;
  file_05.m_begin = (iterator)&local_9c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_9d8,
             msg_05);
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = FillableSigningProvider::AddCScript(&keystore,&scriptPubkey1L);
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_11aadca;
  input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xc3eb3e;
  local_828._8_8_ = local_828._8_8_ & 0xffffffffffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_0113a070;
  local_818[0] = boost::unit_test::lazy_ostream::inst;
  local_9e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_9e0 = "";
  pvVar4 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_818[1] = (undefined1 *)&input2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&input1,(lazy_ostream *)local_828,1,0,WARN,_cVar7,
             (size_t)&local_9e8,0x278);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_9f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_9f0 = "";
  local_a08 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a00 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar6;
  msg_06.m_begin = pvVar4;
  file_06.m_end = (iterator)0x279;
  file_06.m_begin = (iterator)&local_9f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_a08,
             msg_06);
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = FillableSigningProvider::AddCScript(&keystore,&scriptPubkey2L);
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_11aade4;
  input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xc3eb62;
  local_828._8_8_ = local_828._8_8_ & 0xffffffffffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_0113a070;
  local_818[0] = boost::unit_test::lazy_ostream::inst;
  local_a18 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_a10 = "";
  pvVar4 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_818[1] = (undefined1 *)&input2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&input1,(lazy_ostream *)local_828,1,0,WARN,_cVar7,
             (size_t)&local_a18,0x279);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_a28 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_a20 = "";
  local_a38 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a30 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = pvVar6;
  msg_07.m_begin = pvVar4;
  file_07.m_end = (iterator)0x27a;
  file_07.m_begin = (iterator)&local_a28;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_a38,
             msg_07);
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = FillableSigningProvider::AddCScript(&keystore,&scriptMulti);
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_11aadf0;
  input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xc3eb83;
  local_828._8_8_ = local_828._8_8_ & 0xffffffffffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_0113a070;
  local_818[0] = boost::unit_test::lazy_ostream::inst;
  local_a48 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_a40 = "";
  pvVar4 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_818[1] = (undefined1 *)&input2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&input1,(lazy_ostream *)local_828,1,0,WARN,_cVar7,
             (size_t)&local_a48,0x27a);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  destination_script_1.super_CScriptBase._union._16_8_ = 0;
  destination_script_1.super_CScriptBase._24_8_ = 0;
  destination_script_1.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  destination_script_1.super_CScriptBase._union._8_8_ = 0;
  destination_script_2.super_CScriptBase._union._16_8_ = 0;
  destination_script_2.super_CScriptBase._24_8_ = 0;
  destination_script_2.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  destination_script_2.super_CScriptBase._union._8_8_ = 0;
  destination_script_1L.super_CScriptBase._union._16_8_ = 0;
  destination_script_1L.super_CScriptBase._24_8_ = 0;
  destination_script_1L.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  destination_script_1L.super_CScriptBase._union._8_8_ = 0;
  destination_script_2L.super_CScriptBase._union._16_8_ = 0;
  destination_script_2L.super_CScriptBase._24_8_ = 0;
  destination_script_2L.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  destination_script_2L.super_CScriptBase._union._8_8_ = 0;
  destination_script_multi.super_CScriptBase._union._16_8_ = 0;
  destination_script_multi.super_CScriptBase._24_8_ = 0;
  destination_script_multi.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  destination_script_multi.super_CScriptBase._union._8_8_ = 0;
  WitnessV0KeyHash::WitnessV0KeyHash((WitnessV0KeyHash *)&input2,&pubkey1);
  local_828._0_8_ =
       input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_828._8_8_ =
       input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_7e0[0].direct[0] = '\x05';
  GetScriptForDestination((CScript *)&input1,(CTxDestination *)local_828);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&destination_script_1.super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&input1);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&input1);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_828);
  WitnessV0KeyHash::WitnessV0KeyHash((WitnessV0KeyHash *)&input2,&pubkey2);
  local_828._0_8_ =
       input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_828._8_8_ =
       input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_7e0[0].direct[0] = '\x05';
  GetScriptForDestination((CScript *)&input1,(CTxDestination *)local_828);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&destination_script_2.super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&input1);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&input1);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_828);
  WitnessV0KeyHash::WitnessV0KeyHash((WitnessV0KeyHash *)&input2,&pubkey1L);
  local_828._0_8_ =
       input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_828._8_8_ =
       input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_7e0[0].direct[0] = '\x05';
  GetScriptForDestination((CScript *)&input1,(CTxDestination *)local_828);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&destination_script_1L.super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&input1);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&input1);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_828);
  WitnessV0KeyHash::WitnessV0KeyHash((WitnessV0KeyHash *)&input2,&pubkey2L);
  local_818[0] = (undefined1 *)
                 CONCAT44(local_818[0]._4_4_,
                          input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._0_4_);
  local_828._0_8_ =
       input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_828._8_8_ =
       input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_7e0[0].direct[0] = '\x05';
  GetScriptForDestination((CScript *)&input1,(CTxDestination *)local_828);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&destination_script_2L.super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&input1);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&input1);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_828);
  WitnessV0ScriptHash::WitnessV0ScriptHash((WitnessV0ScriptHash *)&input2,&scriptMulti);
  local_818[1] = (undefined1 *)
                 input2.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_start;
  local_828._0_8_ =
       input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_828._8_8_ =
       input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_7e0[0].direct[0] = '\x04';
  GetScriptForDestination((CScript *)&input1,(CTxDestination *)local_828);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&destination_script_multi.super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&input1);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&input1);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_828);
  local_a58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_a50 = "";
  local_a68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a60 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = pvVar6;
  msg_08.m_begin = pvVar4;
  file_08.m_end = (iterator)0x281;
  file_08.m_begin = (iterator)&local_a58;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_a68,
             msg_08);
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = FillableSigningProvider::AddCScript(&keystore,&destination_script_1);
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_11aadfc;
  input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xc3ebad;
  local_828._8_8_ = local_828._8_8_ & 0xffffffffffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_0113a070;
  local_818[0] = boost::unit_test::lazy_ostream::inst;
  local_a78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_a70 = "";
  pvVar4 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_818[1] = (undefined1 *)&input2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&input1,(lazy_ostream *)local_828,1,0,WARN,_cVar7,
             (size_t)&local_a78,0x281);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_a88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_a80 = "";
  local_a98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a90 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = pvVar6;
  msg_09.m_begin = pvVar4;
  file_09.m_end = (iterator)0x282;
  file_09.m_begin = (iterator)&local_a88;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_a98,
             msg_09);
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = FillableSigningProvider::AddCScript(&keystore,&destination_script_2);
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_11aae08;
  input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xc3ebd7;
  local_828._8_8_ = local_828._8_8_ & 0xffffffffffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_0113a070;
  local_818[0] = boost::unit_test::lazy_ostream::inst;
  local_aa8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_aa0 = "";
  pvVar4 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_818[1] = (undefined1 *)&input2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&input1,(lazy_ostream *)local_828,1,0,WARN,_cVar7,
             (size_t)&local_aa8,0x282);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_ab8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_ab0 = "";
  local_ac8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ac0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = pvVar6;
  msg_10.m_begin = pvVar4;
  file_10.m_end = (iterator)0x283;
  file_10.m_begin = (iterator)&local_ab8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_ac8,
             msg_10);
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = FillableSigningProvider::AddCScript(&keystore,&destination_script_1L);
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_11aae14;
  input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xc3ec02;
  local_828._8_8_ = local_828._8_8_ & 0xffffffffffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_0113a070;
  local_818[0] = boost::unit_test::lazy_ostream::inst;
  local_ad8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_ad0 = "";
  pvVar4 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_818[1] = (undefined1 *)&input2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&input1,(lazy_ostream *)local_828,1,0,WARN,_cVar7,
             (size_t)&local_ad8,0x283);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_ae8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_ae0 = "";
  local_af8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_af0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = pvVar6;
  msg_11.m_begin = pvVar4;
  file_11.m_end = (iterator)0x284;
  file_11.m_begin = (iterator)&local_ae8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_af8,
             msg_11);
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = FillableSigningProvider::AddCScript(&keystore,&destination_script_2L);
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_11aae20;
  input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xc3ec2d;
  local_828._8_8_ = local_828._8_8_ & 0xffffffffffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_0113a070;
  local_818[0] = boost::unit_test::lazy_ostream::inst;
  local_b08 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_b00 = "";
  pvVar4 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_818[1] = (undefined1 *)&input2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&input1,(lazy_ostream *)local_828,1,0,WARN,_cVar7,
             (size_t)&local_b08,0x284);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_b18 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_b10 = "";
  local_b28 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b20 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_12.m_end = pvVar6;
  msg_12.m_begin = pvVar4;
  file_12.m_end = (iterator)0x285;
  file_12.m_begin = (iterator)&local_b18;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_b28,
             msg_12);
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = FillableSigningProvider::AddCScript(&keystore,&destination_script_multi);
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_11aae2c;
  input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xc3ec5b;
  local_828._8_8_ = local_828._8_8_ & 0xffffffffffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_0113a070;
  local_818[0] = boost::unit_test::lazy_ostream::inst;
  local_b38 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_b30 = "";
  pvVar4 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_818[1] = (undefined1 *)&input2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&input1,(lazy_ostream *)local_828,1,0,WARN,_cVar7,
             (size_t)&local_b38,0x285);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_b48 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_b40 = "";
  local_b58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b50 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_13.m_end = pvVar6;
  msg_13.m_begin = pvVar4;
  file_13.m_end = (iterator)0x286;
  file_13.m_begin = (iterator)&local_b48;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_b58,
             msg_13);
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = FillableSigningProvider::AddCScript(&keystore2,&scriptMulti);
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_11aae38;
  input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xc3ec7d;
  local_828._8_8_ = local_828._8_8_ & 0xffffffffffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_0113a070;
  local_818[0] = boost::unit_test::lazy_ostream::inst;
  local_b68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_b60 = "";
  pvVar4 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_818[1] = (undefined1 *)&input2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&input1,(lazy_ostream *)local_828,1,0,WARN,_cVar7,
             (size_t)&local_b68,0x286);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_b78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_b70 = "";
  local_b88 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b80 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_14.m_end = pvVar6;
  msg_14.m_begin = pvVar4;
  file_14.m_end = (iterator)0x287;
  file_14.m_begin = (iterator)&local_b78;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_b88,
             msg_14);
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = FillableSigningProvider::AddCScript(&keystore2,&destination_script_multi);
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_11aae44;
  input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xc3ecac;
  local_828._8_8_ = local_828._8_8_ & 0xffffffffffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_0113a070;
  local_818[0] = boost::unit_test::lazy_ostream::inst;
  local_b98 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_b90 = "";
  pvVar4 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_818[1] = (undefined1 *)&input2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&input1,(lazy_ostream *)local_828,1,0,WARN,_cVar7,
             (size_t)&local_b98,0x287);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_ba8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_ba0 = "";
  local_bb8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_bb0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_15.m_end = pvVar6;
  msg_15.m_begin = pvVar4;
  file_15.m_end = (iterator)0x288;
  file_15.m_begin = (iterator)&local_ba8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_bb8,
             msg_15);
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = FillableSigningProvider::AddKeyPubKey(&keystore2,&key3,&pubkey3);
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_11aae50;
  input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xc3ecd2;
  local_828._8_8_ = local_828._8_8_ & 0xffffffffffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_0113a070;
  local_818[0] = boost::unit_test::lazy_ostream::inst;
  local_bc8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_bc0 = "";
  pvVar6 = (iterator)0x0;
  local_818[1] = (undefined1 *)&input2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&input1,(lazy_ostream *)local_828,1,0,WARN,_cVar7,
             (size_t)&local_bc8,0x288);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  output1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  output1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  output2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  output2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  CMutableTransaction::CMutableTransaction(&input1);
  CMutableTransaction::CMutableTransaction(&input2);
  CreateCreditAndSpend(&keystore,&scriptPubkey1,&output1,&input1,true);
  CreateCreditAndSpend(&keystore,&scriptPubkey2,&output2,&input2,true);
  CheckWithFlag(&output1,&input1,0,true);
  CheckWithFlag(&output1,&input1,1,true);
  CheckWithFlag(&output1,&input1,0x801,true);
  CheckWithFlag(&output1,&input1,0x1fffdf,true);
  CheckWithFlag(&output1,&input2,0,false);
  CheckWithFlag(&output1,&input2,1,false);
  CheckWithFlag(&output1,&input2,0x801,false);
  CheckWithFlag(&output1,&input2,0x1fffdf,false);
  ScriptHash::ScriptHash((ScriptHash *)&local_490,&scriptPubkey1);
  local_828._0_8_ = local_490;
  local_828._8_8_ = puStack_488;
  local_7e0[0].direct[0] = '\x03';
  GetScriptForDestination((CScript *)local_478,(CTxDestination *)local_828);
  CreateCreditAndSpend(&keystore,(CScript *)local_478,&output1,&input1,true);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_478);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_828);
  ScriptHash::ScriptHash((ScriptHash *)&local_490,&scriptPubkey2);
  local_828._0_8_ = local_490;
  local_828._8_8_ = puStack_488;
  local_7e0[0].direct[0] = '\x03';
  GetScriptForDestination((CScript *)local_478,(CTxDestination *)local_828);
  CreateCreditAndSpend(&keystore,(CScript *)local_478,&output2,&input2,true);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_478);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_828);
  ReplaceRedeemScript(&(input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_start)->scriptSig,&scriptPubkey1);
  CheckWithFlag(&output1,&input1,0,true);
  CheckWithFlag(&output1,&input1,1,true);
  CheckWithFlag(&output1,&input1,0x801,true);
  CheckWithFlag(&output1,&input1,0x1fffdf,true);
  CheckWithFlag(&output1,&input2,0,true);
  CheckWithFlag(&output1,&input2,1,false);
  CheckWithFlag(&output1,&input2,0x801,false);
  CheckWithFlag(&output1,&input2,0x1fffdf,false);
  CreateCreditAndSpend(&keystore,&destination_script_1,&output1,&input1,true);
  CreateCreditAndSpend(&keystore,&destination_script_2,&output2,&input2,true);
  CheckWithFlag(&output1,&input1,0,true);
  CheckWithFlag(&output1,&input1,1,true);
  CheckWithFlag(&output1,&input1,0x801,true);
  CheckWithFlag(&output1,&input1,0x1fffdf,true);
  CheckWithFlag(&output1,&input2,0,true);
  CheckWithFlag(&output1,&input2,1,true);
  CheckWithFlag(&output1,&input2,0x801,false);
  CheckWithFlag(&output1,&input2,0x1fffdf,false);
  ScriptHash::ScriptHash((ScriptHash *)&local_490,&destination_script_1);
  local_828._0_8_ = local_490;
  local_828._8_8_ = puStack_488;
  local_7e0[0].direct[0] = '\x03';
  GetScriptForDestination((CScript *)local_478,(CTxDestination *)local_828);
  CreateCreditAndSpend(&keystore,(CScript *)local_478,&output1,&input1,true);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_478);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_828);
  ScriptHash::ScriptHash((ScriptHash *)&local_490,&destination_script_2);
  local_828._0_8_ = local_490;
  local_828._8_8_ = puStack_488;
  local_7e0[0].direct[0] = '\x03';
  GetScriptForDestination((CScript *)local_478,(CTxDestination *)local_828);
  CreateCreditAndSpend(&keystore,(CScript *)local_478,&output2,&input2,true);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_478);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_828);
  ReplaceRedeemScript(&(input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_start)->scriptSig,&destination_script_1);
  CheckWithFlag(&output1,&input1,0,true);
  CheckWithFlag(&output1,&input1,1,true);
  CheckWithFlag(&output1,&input1,0x801,true);
  CheckWithFlag(&output1,&input1,0x1fffdf,true);
  CheckWithFlag(&output1,&input2,0,true);
  CheckWithFlag(&output1,&input2,1,true);
  CheckWithFlag(&output1,&input2,0x801,false);
  CheckWithFlag(&output1,&input2,0x1fffdf,false);
  CreateCreditAndSpend(&keystore,&scriptPubkey1L,&output1,&input1,true);
  CreateCreditAndSpend(&keystore,&scriptPubkey2L,&output2,&input2,true);
  CheckWithFlag(&output1,&input1,0,true);
  CheckWithFlag(&output1,&input1,1,true);
  CheckWithFlag(&output1,&input1,0x801,true);
  CheckWithFlag(&output1,&input1,0x1fffdf,true);
  CheckWithFlag(&output1,&input2,0,false);
  CheckWithFlag(&output1,&input2,1,false);
  CheckWithFlag(&output1,&input2,0x801,false);
  CheckWithFlag(&output1,&input2,0x1fffdf,false);
  ScriptHash::ScriptHash((ScriptHash *)&local_490,&scriptPubkey1L);
  local_828._0_8_ = local_490;
  local_828._8_8_ = puStack_488;
  local_7e0[0].direct[0] = '\x03';
  GetScriptForDestination((CScript *)local_478,(CTxDestination *)local_828);
  CreateCreditAndSpend(&keystore,(CScript *)local_478,&output1,&input1,true);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_478);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_828);
  ScriptHash::ScriptHash((ScriptHash *)&local_490,&scriptPubkey2L);
  local_828._0_8_ = local_490;
  local_828._8_8_ = puStack_488;
  local_7e0[0].direct[0] = '\x03';
  GetScriptForDestination((CScript *)local_478,(CTxDestination *)local_828);
  CreateCreditAndSpend(&keystore,(CScript *)local_478,&output2,&input2,true);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_478);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_828);
  ReplaceRedeemScript(&(input2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_start)->scriptSig,&scriptPubkey1L);
  CheckWithFlag(&output1,&input1,0,true);
  CheckWithFlag(&output1,&input1,1,true);
  CheckWithFlag(&output1,&input1,0x801,true);
  CheckWithFlag(&output1,&input1,0x1fffdf,true);
  CheckWithFlag(&output1,&input2,0,true);
  CheckWithFlag(&output1,&input2,1,false);
  CheckWithFlag(&output1,&input2,0x801,false);
  CheckWithFlag(&output1,&input2,0x1fffdf,false);
  CreateCreditAndSpend(&keystore,&destination_script_1L,&output1,&input1,false);
  CreateCreditAndSpend(&keystore,&destination_script_2L,&output2,&input2,false);
  ScriptHash::ScriptHash((ScriptHash *)&local_490,&destination_script_1L);
  local_828._0_8_ = local_490;
  local_828._8_8_ = puStack_488;
  local_7e0[0].direct[0] = '\x03';
  GetScriptForDestination((CScript *)local_478,(CTxDestination *)local_828);
  CreateCreditAndSpend(&keystore,(CScript *)local_478,&output1,&input1,false);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_478);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_828);
  ScriptHash::ScriptHash((ScriptHash *)&local_490,&destination_script_2L);
  local_818[0] = (undefined1 *)CONCAT44(local_818[0]._4_4_,local_480._0_4_);
  local_828._0_8_ = local_490;
  local_828._8_8_ = puStack_488;
  local_7e0[0].direct[0] = '\x03';
  GetScriptForDestination((CScript *)local_478,(CTxDestination *)local_828);
  CreateCreditAndSpend(&keystore,(CScript *)local_478,&output2,&input2,false);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_478);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_828);
  CreateCreditAndSpend(&keystore,&scriptMulti,&output1,&input1,false);
  CheckWithFlag(&output1,&input1,0,false);
  pvVar4 = (iterator)0x0;
  CreateCreditAndSpend(&keystore2,&scriptMulti,&output2,&input2,false);
  CheckWithFlag(&output2,&input2,0,false);
  local_c28._48_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_bf0 = "";
  local_c28._32_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_c28._40_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  msg_16.m_end = pvVar6;
  msg_16.m_begin = pvVar4;
  file_16.m_end = (iterator)0x2e5;
  file_16.m_begin = local_c28 + 0x30;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,
             (size_t)(local_c28 + 0x20),msg_16);
  local_478[0] = transaction_identifier<false>::operator==
                           (&(output1.
                              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->hash,
                            &(output2.
                              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->hash);
  local_478._8_8_ = 0;
  local_478._16_8_ = 0;
  local_490 = (_func_int **)0xc3ecd3;
  puStack_488 = "";
  local_828._8_8_ = local_828._8_8_ & 0xffffffffffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_0113a070;
  local_818[0] = boost::unit_test::lazy_ostream::inst;
  local_c28._16_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_c28._24_8_ = "";
  _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_818[1] = (undefined1 *)&local_490;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_478,(lazy_ostream *)local_828,1,0,WARN,_cVar7,
             (size_t)(local_c28 + 0x10),0x2e5);
  boost::detail::shared_count::~shared_count((shared_count *)(local_478 + 0x10));
  pCVar2 = (CTxIn *)CONCAT71(input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                             super__Vector_impl_data._M_start._1_7_,
                             input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                             super__Vector_impl_data._M_start._0_1_);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)local_c28,
             &output1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_c28;
  CombineSignatures((SignatureData *)local_828,&input1,&input2,tx);
  UpdateInput(pCVar2,(SignatureData *)local_828);
  SignatureData::~SignatureData((SignatureData *)local_828);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c28 + 8));
  CheckWithFlag(&output1,&input1,0x1fffdf,true);
  ScriptHash::ScriptHash((ScriptHash *)&local_490,&scriptMulti);
  local_828._0_8_ = local_490;
  local_828._8_8_ = puStack_488;
  local_7e0[0].direct[0] = '\x03';
  GetScriptForDestination((CScript *)local_478,(CTxDestination *)local_828);
  CreateCreditAndSpend(&keystore,(CScript *)local_478,&output1,&input1,false);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_478);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_828);
  CheckWithFlag(&output1,&input1,0,true);
  CheckWithFlag(&output1,&input1,1,false);
  ScriptHash::ScriptHash((ScriptHash *)&local_490,&scriptMulti);
  local_818[0] = (undefined1 *)CONCAT44(local_818[0]._4_4_,local_480._0_4_);
  local_828._0_8_ = local_490;
  local_828._8_8_ = puStack_488;
  local_7e0[0].direct[0] = '\x03';
  GetScriptForDestination((CScript *)local_478,(CTxDestination *)local_828);
  pvVar4 = (iterator)0x0;
  CreateCreditAndSpend(&keystore2,(CScript *)local_478,&output2,&input2,false);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_478);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_828);
  CheckWithFlag(&output2,&input2,0,true);
  CheckWithFlag(&output2,&input2,1,false);
  local_c68._48_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_c30 = "";
  local_c68._32_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_c68._40_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  msg_17.m_end = pvVar6;
  msg_17.m_begin = pvVar4;
  file_17.m_end = (iterator)0x2f0;
  file_17.m_begin = local_c68 + 0x30;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,
             (size_t)(local_c68 + 0x20),msg_17);
  local_478[0] = transaction_identifier<false>::operator==
                           (&(output1.
                              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->hash,
                            &(output2.
                              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->hash);
  local_478._8_8_ = 0;
  local_478._16_8_ = 0;
  local_490 = (_func_int **)0xc3ecd3;
  puStack_488 = "";
  local_828._8_8_ = local_828._8_8_ & 0xffffffffffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_0113a070;
  local_818[0] = boost::unit_test::lazy_ostream::inst;
  local_c68._16_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_c68._24_8_ = "";
  _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_818[1] = (undefined1 *)&local_490;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_478,(lazy_ostream *)local_828,1,0,WARN,_cVar7,
             (size_t)(local_c68 + 0x10),0x2f0);
  boost::detail::shared_count::~shared_count((shared_count *)(local_478 + 0x10));
  pCVar2 = (CTxIn *)CONCAT71(input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                             super__Vector_impl_data._M_start._1_7_,
                             input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                             super__Vector_impl_data._M_start._0_1_);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)local_c68,
             &output1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  tx_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  tx_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_c68;
  CombineSignatures((SignatureData *)local_828,&input1,&input2,tx_00);
  UpdateInput(pCVar2,(SignatureData *)local_828);
  SignatureData::~SignatureData((SignatureData *)local_828);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c68 + 8));
  CheckWithFlag(&output1,&input1,1,true);
  CheckWithFlag(&output1,&input1,0x1fffdf,true);
  CreateCreditAndSpend(&keystore,&destination_script_multi,&output1,&input1,false);
  CheckWithFlag(&output1,&input1,0,true);
  CheckWithFlag(&output1,&input1,0x801,false);
  pvVar4 = (iterator)0x0;
  CreateCreditAndSpend(&keystore2,&destination_script_multi,&output2,&input2,false);
  CheckWithFlag(&output2,&input2,0,true);
  CheckWithFlag(&output2,&input2,0x801,false);
  local_ca8._48_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_c70 = "";
  local_ca8._32_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_ca8._40_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  msg_18.m_end = pvVar6;
  msg_18.m_begin = pvVar4;
  file_18.m_end = (iterator)0x2fc;
  file_18.m_begin = local_ca8 + 0x30;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,
             (size_t)(local_ca8 + 0x20),msg_18);
  local_478[0] = transaction_identifier<false>::operator==
                           (&(output1.
                              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->hash,
                            &(output2.
                              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->hash);
  local_478._8_8_ = 0;
  local_478._16_8_ = 0;
  local_490 = (_func_int **)0xc3ecd3;
  puStack_488 = "";
  local_828._8_8_ = local_828._8_8_ & 0xffffffffffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_0113a070;
  local_818[0] = boost::unit_test::lazy_ostream::inst;
  local_ca8._16_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_ca8._24_8_ = "";
  _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_818[1] = (undefined1 *)&local_490;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_478,(lazy_ostream *)local_828,1,0,WARN,_cVar7,
             (size_t)(local_ca8 + 0x10),0x2fc);
  boost::detail::shared_count::~shared_count((shared_count *)(local_478 + 0x10));
  pCVar2 = (CTxIn *)CONCAT71(input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                             super__Vector_impl_data._M_start._1_7_,
                             input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                             super__Vector_impl_data._M_start._0_1_);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)local_ca8,
             &output1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  tx_01.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  tx_01.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_ca8;
  CombineSignatures((SignatureData *)local_828,&input1,&input2,tx_01);
  UpdateInput(pCVar2,(SignatureData *)local_828);
  SignatureData::~SignatureData((SignatureData *)local_828);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_ca8 + 8));
  CheckWithFlag(&output1,&input1,0x801,true);
  CheckWithFlag(&output1,&input1,0x1fffdf,true);
  ScriptHash::ScriptHash((ScriptHash *)&local_490,&destination_script_multi);
  local_828._0_8_ = local_490;
  local_828._8_8_ = puStack_488;
  local_7e0[0].direct[0] = '\x03';
  GetScriptForDestination((CScript *)local_478,(CTxDestination *)local_828);
  CreateCreditAndSpend(&keystore,(CScript *)local_478,&output1,&input1,false);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_478);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_828);
  CheckWithFlag(&output1,&input1,1,true);
  CheckWithFlag(&output1,&input1,0x801,false);
  ScriptHash::ScriptHash((ScriptHash *)&local_490,&destination_script_multi);
  local_818[0] = (undefined1 *)CONCAT44(local_818[0]._4_4_,local_480._0_4_);
  local_828._0_8_ = local_490;
  local_828._8_8_ = puStack_488;
  local_7e0[0].direct[0] = '\x03';
  GetScriptForDestination((CScript *)local_478,(CTxDestination *)local_828);
  pvVar4 = (iterator)0x0;
  CreateCreditAndSpend(&keystore2,(CScript *)local_478,&output2,&input2,false);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_478);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_828);
  CheckWithFlag(&output2,&input2,1,true);
  CheckWithFlag(&output2,&input2,0x801,false);
  local_ce8._48_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_cb0 = "";
  local_ce8._32_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_ce8._40_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  msg_19.m_end = pvVar6;
  msg_19.m_begin = pvVar4;
  file_19.m_end = (iterator)0x308;
  file_19.m_begin = local_ce8 + 0x30;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,
             (size_t)(local_ce8 + 0x20),msg_19);
  local_478[0] = transaction_identifier<false>::operator==
                           (&(output1.
                              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->hash,
                            &(output2.
                              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->hash);
  local_478._8_8_ = 0;
  local_478._16_8_ = 0;
  local_490 = (_func_int **)0xc3ecd3;
  puStack_488 = "";
  local_828._8_8_ = local_828._8_8_ & 0xffffffffffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_0113a070;
  local_818[0] = boost::unit_test::lazy_ostream::inst;
  local_ce8._16_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_ce8._24_8_ = "";
  _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&DAT_00000001;
  local_818[1] = (undefined1 *)&local_490;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_478,(lazy_ostream *)local_828,1,0,WARN,_cVar7,
             (size_t)(local_ce8 + 0x10),0x308);
  boost::detail::shared_count::~shared_count((shared_count *)(local_478 + 0x10));
  pCVar2 = (CTxIn *)CONCAT71(input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                             super__Vector_impl_data._M_start._1_7_,
                             input1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                             super__Vector_impl_data._M_start._0_1_);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)local_ce8,
             &output1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  tx_02.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  tx_02.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_ce8;
  CombineSignatures((SignatureData *)local_828,&input1,&input2,tx_02);
  UpdateInput(pCVar2,(SignatureData *)local_828);
  SignatureData::~SignatureData((SignatureData *)local_828);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_ce8 + 8));
  CheckWithFlag(&output1,&input1,0x801,true);
  CheckWithFlag(&output1,&input1,0x1fffdf,true);
  CMutableTransaction::~CMutableTransaction(&input2);
  CMutableTransaction::~CMutableTransaction(&input1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&output2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&output1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            (&destination_script_multi.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            (&destination_script_2L.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            (&destination_script_1L.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            (&destination_script_2.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            (&destination_script_1.super_CScriptBase);
  std::_Vector_base<CPubKey,_std::allocator<CPubKey>_>::~_Vector_base
            (&oneandthree.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&scriptMulti.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&scriptPubkey2L.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&scriptPubkey1L.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&scriptPubkey2.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&scriptPubkey1.super_CScriptBase);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&key2L.keydata);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&key1L.keydata);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&key3.keydata);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&key2.keydata);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&key1.keydata);
  FillableSigningProvider::~FillableSigningProvider(&keystore2);
  FillableSigningProvider::~FillableSigningProvider(&keystore);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_witness)
{
    FillableSigningProvider keystore, keystore2;
    CKey key1 = GenerateRandomKey();
    CKey key2 = GenerateRandomKey();
    CKey key3 = GenerateRandomKey();
    CKey key1L = GenerateRandomKey(/*compressed=*/false);
    CKey key2L = GenerateRandomKey(/*compressed=*/false);
    CPubKey pubkey1 = key1.GetPubKey();
    CPubKey pubkey2 = key2.GetPubKey();
    CPubKey pubkey3 = key3.GetPubKey();
    CPubKey pubkey1L = key1L.GetPubKey();
    CPubKey pubkey2L = key2L.GetPubKey();
    BOOST_CHECK(keystore.AddKeyPubKey(key1, pubkey1));
    BOOST_CHECK(keystore.AddKeyPubKey(key2, pubkey2));
    BOOST_CHECK(keystore.AddKeyPubKey(key1L, pubkey1L));
    BOOST_CHECK(keystore.AddKeyPubKey(key2L, pubkey2L));
    CScript scriptPubkey1, scriptPubkey2, scriptPubkey1L, scriptPubkey2L, scriptMulti;
    scriptPubkey1 << ToByteVector(pubkey1) << OP_CHECKSIG;
    scriptPubkey2 << ToByteVector(pubkey2) << OP_CHECKSIG;
    scriptPubkey1L << ToByteVector(pubkey1L) << OP_CHECKSIG;
    scriptPubkey2L << ToByteVector(pubkey2L) << OP_CHECKSIG;
    std::vector<CPubKey> oneandthree;
    oneandthree.push_back(pubkey1);
    oneandthree.push_back(pubkey3);
    scriptMulti = GetScriptForMultisig(2, oneandthree);
    BOOST_CHECK(keystore.AddCScript(scriptPubkey1));
    BOOST_CHECK(keystore.AddCScript(scriptPubkey2));
    BOOST_CHECK(keystore.AddCScript(scriptPubkey1L));
    BOOST_CHECK(keystore.AddCScript(scriptPubkey2L));
    BOOST_CHECK(keystore.AddCScript(scriptMulti));
    CScript destination_script_1, destination_script_2, destination_script_1L, destination_script_2L, destination_script_multi;
    destination_script_1 = GetScriptForDestination(WitnessV0KeyHash(pubkey1));
    destination_script_2 = GetScriptForDestination(WitnessV0KeyHash(pubkey2));
    destination_script_1L = GetScriptForDestination(WitnessV0KeyHash(pubkey1L));
    destination_script_2L = GetScriptForDestination(WitnessV0KeyHash(pubkey2L));
    destination_script_multi = GetScriptForDestination(WitnessV0ScriptHash(scriptMulti));
    BOOST_CHECK(keystore.AddCScript(destination_script_1));
    BOOST_CHECK(keystore.AddCScript(destination_script_2));
    BOOST_CHECK(keystore.AddCScript(destination_script_1L));
    BOOST_CHECK(keystore.AddCScript(destination_script_2L));
    BOOST_CHECK(keystore.AddCScript(destination_script_multi));
    BOOST_CHECK(keystore2.AddCScript(scriptMulti));
    BOOST_CHECK(keystore2.AddCScript(destination_script_multi));
    BOOST_CHECK(keystore2.AddKeyPubKey(key3, pubkey3));

    CTransactionRef output1, output2;
    CMutableTransaction input1, input2;

    // Normal pay-to-compressed-pubkey.
    CreateCreditAndSpend(keystore, scriptPubkey1, output1, input1);
    CreateCreditAndSpend(keystore, scriptPubkey2, output2, input2);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, STANDARD_SCRIPT_VERIFY_FLAGS, true);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_NONE, false);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_P2SH, false);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_P2SH, false);
    CheckWithFlag(output1, input2, STANDARD_SCRIPT_VERIFY_FLAGS, false);

    // P2SH pay-to-compressed-pubkey.
    CreateCreditAndSpend(keystore, GetScriptForDestination(ScriptHash(scriptPubkey1)), output1, input1);
    CreateCreditAndSpend(keystore, GetScriptForDestination(ScriptHash(scriptPubkey2)), output2, input2);
    ReplaceRedeemScript(input2.vin[0].scriptSig, scriptPubkey1);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, STANDARD_SCRIPT_VERIFY_FLAGS, true);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_P2SH, false);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_P2SH, false);
    CheckWithFlag(output1, input2, STANDARD_SCRIPT_VERIFY_FLAGS, false);

    // Witness pay-to-compressed-pubkey (v0).
    CreateCreditAndSpend(keystore, destination_script_1, output1, input1);
    CreateCreditAndSpend(keystore, destination_script_2, output2, input2);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, STANDARD_SCRIPT_VERIFY_FLAGS, true);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_P2SH, false);
    CheckWithFlag(output1, input2, STANDARD_SCRIPT_VERIFY_FLAGS, false);

    // P2SH witness pay-to-compressed-pubkey (v0).
    CreateCreditAndSpend(keystore, GetScriptForDestination(ScriptHash(destination_script_1)), output1, input1);
    CreateCreditAndSpend(keystore, GetScriptForDestination(ScriptHash(destination_script_2)), output2, input2);
    ReplaceRedeemScript(input2.vin[0].scriptSig, destination_script_1);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, STANDARD_SCRIPT_VERIFY_FLAGS, true);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_P2SH, false);
    CheckWithFlag(output1, input2, STANDARD_SCRIPT_VERIFY_FLAGS, false);

    // Normal pay-to-uncompressed-pubkey.
    CreateCreditAndSpend(keystore, scriptPubkey1L, output1, input1);
    CreateCreditAndSpend(keystore, scriptPubkey2L, output2, input2);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, STANDARD_SCRIPT_VERIFY_FLAGS, true);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_NONE, false);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_P2SH, false);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_P2SH, false);
    CheckWithFlag(output1, input2, STANDARD_SCRIPT_VERIFY_FLAGS, false);

    // P2SH pay-to-uncompressed-pubkey.
    CreateCreditAndSpend(keystore, GetScriptForDestination(ScriptHash(scriptPubkey1L)), output1, input1);
    CreateCreditAndSpend(keystore, GetScriptForDestination(ScriptHash(scriptPubkey2L)), output2, input2);
    ReplaceRedeemScript(input2.vin[0].scriptSig, scriptPubkey1L);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, STANDARD_SCRIPT_VERIFY_FLAGS, true);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_P2SH, false);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_P2SH, false);
    CheckWithFlag(output1, input2, STANDARD_SCRIPT_VERIFY_FLAGS, false);

    // Signing disabled for witness pay-to-uncompressed-pubkey (v1).
    CreateCreditAndSpend(keystore, destination_script_1L, output1, input1, false);
    CreateCreditAndSpend(keystore, destination_script_2L, output2, input2, false);

    // Signing disabled for P2SH witness pay-to-uncompressed-pubkey (v1).
    CreateCreditAndSpend(keystore, GetScriptForDestination(ScriptHash(destination_script_1L)), output1, input1, false);
    CreateCreditAndSpend(keystore, GetScriptForDestination(ScriptHash(destination_script_2L)), output2, input2, false);

    // Normal 2-of-2 multisig
    CreateCreditAndSpend(keystore, scriptMulti, output1, input1, false);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_NONE, false);
    CreateCreditAndSpend(keystore2, scriptMulti, output2, input2, false);
    CheckWithFlag(output2, input2, SCRIPT_VERIFY_NONE, false);
    BOOST_CHECK(*output1 == *output2);
    UpdateInput(input1.vin[0], CombineSignatures(input1, input2, output1));
    CheckWithFlag(output1, input1, STANDARD_SCRIPT_VERIFY_FLAGS, true);

    // P2SH 2-of-2 multisig
    CreateCreditAndSpend(keystore, GetScriptForDestination(ScriptHash(scriptMulti)), output1, input1, false);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_P2SH, false);
    CreateCreditAndSpend(keystore2, GetScriptForDestination(ScriptHash(scriptMulti)), output2, input2, false);
    CheckWithFlag(output2, input2, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output2, input2, SCRIPT_VERIFY_P2SH, false);
    BOOST_CHECK(*output1 == *output2);
    UpdateInput(input1.vin[0], CombineSignatures(input1, input2, output1));
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, STANDARD_SCRIPT_VERIFY_FLAGS, true);

    // Witness 2-of-2 multisig
    CreateCreditAndSpend(keystore, destination_script_multi, output1, input1, false);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS, false);
    CreateCreditAndSpend(keystore2, destination_script_multi, output2, input2, false);
    CheckWithFlag(output2, input2, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output2, input2, SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS, false);
    BOOST_CHECK(*output1 == *output2);
    UpdateInput(input1.vin[0], CombineSignatures(input1, input2, output1));
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS, true);
    CheckWithFlag(output1, input1, STANDARD_SCRIPT_VERIFY_FLAGS, true);

    // P2SH witness 2-of-2 multisig
    CreateCreditAndSpend(keystore, GetScriptForDestination(ScriptHash(destination_script_multi)), output1, input1, false);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS, false);
    CreateCreditAndSpend(keystore2, GetScriptForDestination(ScriptHash(destination_script_multi)), output2, input2, false);
    CheckWithFlag(output2, input2, SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output2, input2, SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS, false);
    BOOST_CHECK(*output1 == *output2);
    UpdateInput(input1.vin[0], CombineSignatures(input1, input2, output1));
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS, true);
    CheckWithFlag(output1, input1, STANDARD_SCRIPT_VERIFY_FLAGS, true);
}